

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hh
# Opt level: O3

void __thiscall avro::Exception::~Exception(Exception *this)

{
  _func_int *p_Var1;
  
  p_Var1 = this->_vptr_Exception[-3];
  std::runtime_error::~runtime_error((runtime_error *)(&this->field_0x8 + (long)p_Var1));
  operator_delete((_func_int *)((long)&this->_vptr_Exception + (long)p_Var1),0x18);
  return;
}

Assistant:

class AVRO_DECL Exception : public virtual std::runtime_error
{
  public:

    Exception(const std::string &msg) :
        std::runtime_error(msg)
    { }

    Exception(const boost::format &msg) :
        std::runtime_error( boost::str(msg))
    { }  
}